

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<lest::approx_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<lest::approx_const&> *this,double *rhs)

{
  double dVar1;
  double dVar2;
  lest *this_00;
  double *in_R8;
  double dVar3;
  string local_88;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  approx local_48;
  
  this_00 = *(lest **)this;
  local_68 = *rhs;
  uStack_60 = 0;
  local_58 = *(double *)(this_00 + 0x10);
  uStack_50 = 0;
  dVar1 = *(double *)this_00;
  dVar2 = *(double *)(this_00 + 8);
  local_48.epsilon_ = (double)&local_48.magnitude_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"==","");
  to_string<lest::approx,double>(&local_88,this_00,&local_48,(string *)rhs,in_R8);
  dVar3 = ABS(local_58);
  if (ABS(local_68) <= ABS(local_58)) {
    dVar3 = ABS(local_68);
  }
  __return_storage_ptr__->passed = ABS(local_68 - local_58) < dVar1 * (dVar2 + dVar3);
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((double *)local_48.epsilon_ != &local_48.magnitude_) {
    operator_delete((void *)local_48.epsilon_);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result{ lhs <  rhs, to_string( lhs, "<" , rhs ) }; }